

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O1

MessageType getMessageType(Document *message)

{
  undefined8 uVar1;
  MessageType MVar2;
  Number in_RAX;
  Number NVar3;
  Number NVar4;
  undefined8 local_28;
  
  local_28 = in_RAX;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd8,(Ch *)message);
  uVar1 = local_28;
  NVar3.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(&message->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          );
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&stack0xffffffffffffffd8,(Ch *)message);
  NVar4.i = (I)rapidjson::
               GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::MemberEnd(&message->
                            super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          );
  MVar2 = (local_28 == NVar4.i64) + Notification;
  if (uVar1 != NVar3.i64) {
    MVar2 = (uint)(local_28 == NVar4.i64);
  }
  return MVar2;
}

Assistant:

MessageType getMessageType (Document &message) {
    bool hasId = message.HasMember("id");
    bool hasMethod = message.HasMember("method");

    if (hasId) {
        if (hasMethod) {
            return MessageType::Request;
        }
        return MessageType::Response;
    }

    if (hasMethod) {
        return MessageType::Notification;
    }

    return MessageType::Unknown;
}